

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

void Term_big_putch(wchar_t x,wchar_t y,wchar_t a,wchar_t c)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  
  cVar3 = (char)a;
  if (tile_width < 2) {
    if (1 < tile_height) {
      uVar4 = 1;
      do {
        if (cVar3 < '\0') {
          wVar2 = L'ÿ';
          wVar1 = L'\xffffffff';
        }
        else {
          wVar2 = L'\x01';
          wVar1 = L' ';
        }
        Term_putch(x,y + uVar4,wVar2,wVar1);
        uVar4 = uVar4 + 1;
      } while (uVar4 < tile_height);
    }
  }
  else {
    uVar4 = 0;
    do {
      if (uVar4 != 0) {
        if (cVar3 < '\0') {
          wVar2 = L'ÿ';
          wVar1 = L'\xffffffff';
        }
        else {
          wVar2 = L'\x01';
          wVar1 = L' ';
        }
        Term_putch(uVar4 + x,y,wVar2,wVar1);
      }
      if (1 < tile_height) {
        uVar5 = 1;
        do {
          if (cVar3 < '\0') {
            wVar2 = L'ÿ';
            wVar1 = L'\xffffffff';
          }
          else {
            wVar2 = L'\x01';
            wVar1 = L' ';
          }
          Term_putch(uVar4 + x,y + uVar5,wVar2,wVar1);
          uVar5 = uVar5 + 1;
        } while (uVar5 < tile_height);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < tile_width);
  }
  return;
}

Assistant:

void Term_big_putch(int x, int y, int a, wchar_t c)
{
	int hor, vert;

	/* Avoid warning */
	(void)c;

	/* No tall skinny tiles */
	if (tile_width > 1) {
		/* Horizontal first */
		for (hor = 0; hor < tile_width; hor++) {
			/* Queue dummy character */
			if (hor != 0) {
				if (a & 0x80)
					Term_putch(x + hor, y, 255, -1);
				else
					Term_putch(x + hor, y, COLOUR_WHITE, L' ');
			}

			/* Now vertical */
			for (vert = 1; vert < tile_height; vert++) {
				/* Queue dummy character */
				if (a & 0x80)
					Term_putch(x + hor, y + vert, 255, -1);
				else
					Term_putch(x + hor, y + vert, COLOUR_WHITE, L' ');
			}
		}
	} else {
		/* Only vertical */
		for (vert = 1; vert < tile_height; vert++) {
			/* Queue dummy character */
			if (a & 0x80)
				Term_putch(x, y + vert, 255, -1);
			else
				Term_putch(x, y + vert, COLOUR_WHITE, L' ');
		}
	}
}